

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

void __thiscall ON_OBSOLETE_V5_DimRadial::ON_OBSOLETE_V5_DimRadial(ON_OBSOLETE_V5_DimRadial *this)

{
  ON_2dPointArray *this_00;
  
  ON_OBSOLETE_V5_Annotation::ON_OBSOLETE_V5_Annotation(&this->super_ON_OBSOLETE_V5_Annotation);
  (this->super_ON_OBSOLETE_V5_Annotation).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00822cf8;
  (this->super_ON_OBSOLETE_V5_Annotation).m_type = dtDimDiameter;
  (this->super_ON_OBSOLETE_V5_Annotation).m_textdisplaymode = kInLine;
  ON_OBSOLETE_V5_AnnotationText::SetText
            (&(this->super_ON_OBSOLETE_V5_Annotation).m_usertext,DefaultDiameterText::defstr);
  ON_AnnotationTextFormula::Set(&this->super_ON_OBSOLETE_V5_Annotation,(wchar_t *)0x0);
  this_00 = &(this->super_ON_OBSOLETE_V5_Annotation).m_points;
  ON_SimpleArray<ON_2dPoint>::Reserve(&this_00->super_ON_SimpleArray<ON_2dPoint>,4);
  if (3 < (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
          m_capacity) {
    (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count = 4;
  }
  ON_SimpleArray<ON_2dPoint>::Zero(&this_00->super_ON_SimpleArray<ON_2dPoint>);
  return;
}

Assistant:

ON_OBSOLETE_V5_DimRadial::ON_OBSOLETE_V5_DimRadial()
{
  m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter;
  m_textdisplaymode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kInLine;
  SetTextValue(DefaultDiameterText());
  SetTextFormula(0);
  m_points.Reserve(ON_OBSOLETE_V5_DimRadial::dim_pt_count);
  m_points.SetCount(ON_OBSOLETE_V5_DimRadial::dim_pt_count);
  m_points.Zero();
}